

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

TPZManVector<int,_20> * __thiscall
TPZManVector<int,_20>::operator=(TPZManVector<int,_20> *this,TPZManVector<int,_20> *rval)

{
  long lVar1;
  int *piVar2;
  uint uVar3;
  long lVar4;
  int *piVar5;
  
  if (this != rval) {
    lVar1 = (rval->super_TPZVec<int>).fNElements;
    piVar2 = (this->super_TPZVec<int>).fStore;
    piVar5 = this->fExtAlloc;
    if (piVar2 != piVar5 && piVar2 != (int *)0x0) {
      operator_delete__(piVar2);
      (this->super_TPZVec<int>).fStore = (int *)0x0;
      (this->super_TPZVec<int>).fNAlloc = 0;
    }
    if (lVar1 < 0x15) {
      if (lVar1 < 1) {
        uVar3 = 0;
      }
      else {
        lVar4 = 0;
        do {
          piVar5[lVar4] = rval->fExtAlloc[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar1 != lVar4);
        uVar3 = (uint)lVar1;
      }
      if (uVar3 < 0x14) {
        memset(this->fExtAlloc + uVar3,0,(ulong)(0x13 - uVar3) * 4 + 4);
        lVar4 = 0;
      }
      else {
        lVar4 = 0;
      }
    }
    else {
      piVar5 = (rval->super_TPZVec<int>).fStore;
      lVar4 = lVar1;
    }
    (this->super_TPZVec<int>).fStore = piVar5;
    (this->super_TPZVec<int>).fNAlloc = lVar4;
    (this->super_TPZVec<int>).fNElements = lVar1;
  }
  (rval->super_TPZVec<int>).fStore = (int *)0x0;
  (rval->super_TPZVec<int>).fNElements = 0;
  (rval->super_TPZVec<int>).fNAlloc = 0;
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(TPZManVector< T, NumExtAlloc >&& rval) {
    // Checking auto assignment.
    if (this != &rval) {
      const int64_t nel = rval.NElements();
      //let us dispose of previously allocated memory
      if (this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = nullptr;
        this->fNAlloc = 0;
      }
      if (nel <= NumExtAlloc) {
        //we need to copy, unfortunately
        int i = 0;
        for(; i < nel; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNAlloc = 0;
        this->fNElements = nel;
      } else {
        this->fStore = rval.fStore;
        this->fNAlloc = nel;
        this->fNElements = nel;
      }
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
    return *this;
}